

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

void anon_unknown.dwarf_2609f::replaceAll(string *s,string *search,string *replace)

{
  string *psVar1;
  
  while( true ) {
    psVar1 = (string *)std::__cxx11::string::find((string *)s,(ulong)search);
    if (psVar1 == (string *)0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)s,(ulong)psVar1);
    std::__cxx11::string::insert((ulong)s,psVar1);
  }
  return;
}

Assistant:

void replaceAll(std::string & s, const std::string & search, const std::string & replace) {
        for (size_t pos = 0; ; pos += replace.length()) {
            pos = s.find(search, pos);
            if (pos == std::string::npos) break;
            s.erase(pos, search.length());
            s.insert(pos, replace);
        }
    }